

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O2

void aom_film_grain_table_free(aom_film_grain_table_t *t)

{
  aom_film_grain_table_entry_t *paVar1;
  aom_film_grain_table_entry_t *memblk;
  
  memblk = t->head;
  while (memblk != (aom_film_grain_table_entry_t *)0x0) {
    paVar1 = memblk->next;
    aom_free(memblk);
    memblk = paVar1;
  }
  t->head = (aom_film_grain_table_entry_t *)0x0;
  t->tail = (aom_film_grain_table_entry_t *)0x0;
  return;
}

Assistant:

void aom_film_grain_table_free(aom_film_grain_table_t *t) {
  aom_film_grain_table_entry_t *entry = t->head;
  while (entry) {
    aom_film_grain_table_entry_t *next = entry->next;
    aom_free(entry);
    entry = next;
  }
  memset(t, 0, sizeof(*t));
}